

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall HighsCliqueTable::runCliqueMerging(HighsCliqueTable *this,HighsDomain *globaldomain)

{
  pointer *ppCVar1;
  HighsInt *pHVar2;
  double *pdVar3;
  double dVar4;
  uint uVar5;
  CliqueVar CVar6;
  int iVar7;
  pointer pCVar8;
  pointer pCVar9;
  pointer piVar10;
  pointer puVar11;
  int *piVar12;
  pointer puVar13;
  iterator __position;
  pointer pdVar14;
  pointer pdVar15;
  iterator __position_00;
  vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
  *this_00;
  uint uVar16;
  HighsInt HVar17;
  CliqueVar *pCVar18;
  ValueType *pVVar19;
  uint uVar20;
  CliqueVar *pCVar21;
  long lVar22;
  ulong uVar23;
  pointer pCVar24;
  int iVar25;
  pointer pCVar26;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range2;
  CliqueVar CVar27;
  HighsDomain *pHVar28;
  ulong uVar29;
  ulong uVar30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar31;
  iterator __begin7;
  ulong uVar32;
  long lVar33;
  int *piVar34;
  bool bVar35;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> extensionvars;
  HighsInt cliqueid;
  HighsInt originrow;
  CliqueVar v;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  anon_class_24_3_1a0f6629 addCands;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_108;
  anon_class_8_1_9cafd1bc_conflict local_e8;
  int local_e0;
  uint local_dc;
  HighsDomain *local_d8;
  undefined8 local_d0;
  int local_c4;
  uint local_c0;
  CliqueVar local_bc;
  ulong local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b0;
  int64_t *local_a8;
  vector<int,std::allocator<int>> *local_a0;
  ulong local_98;
  vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
  *local_90;
  HighsRandom *local_88;
  ulong local_80;
  long local_78;
  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  HighsCliqueTable *local_48;
  HighsDomain *local_40;
  pointer local_38;
  
  local_108.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (CliqueVar *)0x0;
  local_108.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
  local_108.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar31 = &this->iscandidate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (pvVar31,(long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8 = globaldomain;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_68,
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar29 = ((long)(this->cliques).
                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->cliques).
                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  if ((ulong)((long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < uVar29) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->cliquehits,uVar29);
  }
  pCVar8 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar9 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar25 = this->numEntries;
  local_c4 = HighsSparseMatrix::numNz(&local_d8->mipsolver->model_->a_matrix_);
  uVar29 = ((long)pCVar8 - (long)pCVar9 >> 2) * -0x3333333333333333;
  pHVar28 = local_d8;
  if ((int)uVar29 == 0) {
    uVar16 = 0;
  }
  else {
    local_c4 = local_c4 + iVar25;
    local_a8 = &this->numNeighbourhoodQueries;
    local_88 = &this->randgen;
    local_70 = (vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
               &this->infeasvertexstack;
    local_90 = (vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                *)&this->cliqueextensions;
    local_a0 = (vector<int,std::allocator<int>> *)&this->deletedrows;
    uVar32 = uVar29 & 0xffffffff;
    uVar30 = 0;
    local_c0 = 0;
    local_b0 = pvVar31;
    local_98 = uVar29;
    local_80 = uVar32;
    do {
      pCVar8 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = pCVar8[uVar30].start;
      uVar29 = (ulong)(int)uVar16;
      if ((uVar29 != 0xffffffffffffffff) &&
         ((pCVar8 = pCVar8 + uVar30, pCVar8->equality != false || (pCVar8->origin != 0x7fffffff))))
      {
        if (pCVar8->origin == -1) {
          local_c0 = (uint)CONCAT71((int7)((ulong)pCVar8 >> 8),1);
        }
        else {
          uVar5 = pCVar8->end;
          bVar35 = false;
          uVar20 = uVar5 - uVar16;
          if (uVar20 != 0) {
            pCVar21 = (this->cliqueentries).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar29;
            CVar27 = *pCVar21;
            uVar32 = (ulong)uVar20;
            if (uVar20 != 1) {
              piVar10 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar25 = piVar10[(int)((int)CVar27 << 1 | (uint)((int)CVar27 < 0))];
              uVar23 = 1;
              do {
                CVar6 = pCVar21[uVar23];
                iVar7 = piVar10[(int)((int)CVar6 << 1 | (uint)((int)CVar6 < 0))];
                if (iVar7 < iVar25) {
                  iVar25 = iVar7;
                  CVar27 = CVar6;
                }
                uVar23 = uVar23 + 1;
              } while (uVar32 != uVar23);
            }
            if (uVar5 != uVar16) {
              uVar23 = 0;
              do {
                (pvVar31->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start
                [(int)((int)pCVar21[uVar23] << 1 | (uint)((int)pCVar21[uVar23] < 0))] = '\x01';
                uVar23 = uVar23 + 1;
              } while (uVar32 != uVar23);
            }
            local_40 = local_d8;
            uVar16 = (int)CVar27 << 1 | (uint)((int)CVar27 < 0);
            local_e8.addCands = (anon_class_24_3_1a0f6629 *)&stack0xffffffffffffffb8;
            local_dc = uVar5;
            local_d0 = uVar29;
            local_b8 = uVar30;
            local_78 = uVar30 * 5;
            local_48 = this;
            local_38 = (pointer)&local_108;
            HighsHashTree<int,_int>::
            for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2113:9)_&,_0>
                      ((NodePtr)(this->invertedHashList).
                                super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)uVar16].root.
                                ptrAndType,&local_e8);
            local_e8.addCands = (anon_class_24_3_1a0f6629 *)&stack0xffffffffffffffb8;
            HighsHashTree<int,_void>::
            for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2116:9)_&,_0>
                      ((NodePtr)(this->invertedHashListSizeTwo).
                                super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)uVar16].root.
                                ptrAndType,&local_e8);
            pvVar31 = local_b0;
            pCVar18 = local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_dc != (uint)local_d0) {
              uVar29 = 0;
              do {
                (local_b0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start
                [(int)((int)pCVar21[uVar29] << 1 | (uint)((int)pCVar21[uVar29] < 0))] = '\0';
                uVar29 = uVar29 + 1;
              } while (uVar32 != uVar29);
            }
            for (; pCVar18 !=
                   local_108.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pCVar18 = pCVar18 + 1) {
              (local_b0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((int)*pCVar18 << 1 | (uint)((int)*pCVar18 < 0))] = '\0';
            }
            if (local_dc != (uint)local_d0) {
              uVar29 = 0;
              do {
                if (local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
                if (pCVar21[uVar29] != CVar27) {
                  HVar17 = shrinkToNeighbourhood
                                     (this,&local_68,local_a8,pCVar21[uVar29],
                                      local_108.
                                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (HighsInt)
                                      ((ulong)((long)local_108.
                                                                                                          
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_108.
                                                                                                        
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2));
                  pCVar18 = local_108.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start + HVar17;
                  if ((pCVar18 !=
                       local_108.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
                     (local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pCVar18)) {
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pCVar18;
                  }
                }
                uVar29 = uVar29 + 1;
              } while (uVar32 != uVar29);
            }
            pHVar28 = local_d8;
            if (local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
                        (local_88,local_108.
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                         (HighsInt)
                         ((ulong)((long)local_108.
                                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_108.
                                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2));
              if ((long)local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0) {
                uVar29 = (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2;
                iVar25 = -1;
                lVar33 = 4;
                uVar32 = 0;
                do {
                  HVar17 = shrinkToNeighbourhood
                                     (this,&local_68,local_a8,
                                      local_108.
                                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar32],
                                      (CliqueVar *)
                                      ((long)&(local_108.
                                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->field_0x0
                                      + lVar33),(int)uVar29 + iVar25);
                  pCVar21 = local_108.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start + (HVar17 + (int)uVar32 + 1);
                  if ((pCVar21 !=
                       local_108.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
                     (local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pCVar21)) {
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pCVar21;
                  }
                  uVar32 = uVar32 + 1;
                  uVar29 = (long)local_108.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_108.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2;
                  iVar25 = iVar25 + -1;
                  lVar33 = lVar33 + 4;
                } while (uVar32 < uVar29);
              }
            }
            pCVar24 = local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pCVar8 = (this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pCVar21 = local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((&pCVar8->equality)[local_78 * 4] == true) {
              for (; pCVar21 != pCVar24; pCVar21 = pCVar21 + 1) {
                vertexInfeasible(this,pHVar28,(uint)*pCVar21 & 0x7fffffff,(uint)*pCVar21 >> 0x1f);
              }
            }
            else {
              pHVar2 = &pCVar8->start + local_78;
              local_e0 = pHVar2[2];
              pHVar2[2] = 0x7fffffff;
              uVar29 = (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              pCVar24 = (this->cliqueentries).
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&local_108,
                         local_108.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pCVar24 + *pHVar2,
                         pCVar24 + pHVar2[1]);
              lVar33 = (long)(uVar29 * 0x40000000) >> 0x1e;
              pCVar21 = (CliqueVar *)
                        ((long)&(local_108.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar33);
              lVar22 = (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar21 >> 4;
              if (0 < lVar22) {
                puVar11 = (this->colDeleted).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pCVar21 = (CliqueVar *)
                          ((long)&pCVar21->field_0x0 +
                          ((long)local_108.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar21 &
                          0xfffffffffffffff0U));
                lVar22 = lVar22 + 1;
                pCVar18 = (CliqueVar *)
                          ((long)&local_108.
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2].field_0x0 + lVar33);
                do {
                  if (puVar11[(uint)pCVar18[-2] & 0x7fffffff] != '\0') {
                    pCVar18 = pCVar18 + -2;
                    goto LAB_00267485;
                  }
                  if (puVar11[(uint)pCVar18[-1] & 0x7fffffff] != '\0') {
                    pCVar18 = pCVar18 + -1;
                    goto LAB_00267485;
                  }
                  if (puVar11[(uint)*pCVar18 & 0x7fffffff] != '\0') goto LAB_00267485;
                  if (puVar11[(uint)pCVar18[1] & 0x7fffffff] != '\0') {
                    pCVar18 = pCVar18 + 1;
                    goto LAB_00267485;
                  }
                  lVar22 = lVar22 + -1;
                  pCVar18 = pCVar18 + 4;
                } while (1 < lVar22);
              }
              lVar33 = (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar21 >> 2;
              if (lVar33 == 1) {
LAB_00267459:
                pCVar18 = pCVar21;
                if ((this->colDeleted).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[(uint)*pCVar21 & 0x7fffffff] == '\0') {
                  pCVar18 = local_108.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
              }
              else if (lVar33 == 2) {
LAB_00267440:
                pCVar18 = pCVar21;
                if ((this->colDeleted).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[(uint)*pCVar21 & 0x7fffffff] == '\0') {
                  pCVar21 = pCVar21 + 1;
                  goto LAB_00267459;
                }
              }
              else {
                pCVar18 = local_108.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if ((lVar33 == 3) &&
                   (pCVar18 = pCVar21,
                   (this->colDeleted).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)*pCVar21 & 0x7fffffff] == '\0')) {
                  pCVar21 = pCVar21 + 1;
                  goto LAB_00267440;
                }
              }
LAB_00267485:
              pCVar21 = pCVar18 + 1;
              if (pCVar21 !=
                  local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish &&
                  pCVar18 !=
                  local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  if ((this->colDeleted).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[(uint)*pCVar21 & 0x7fffffff] == '\0') {
                    *pCVar18 = *pCVar21;
                    pCVar18 = pCVar18 + 1;
                  }
                  pCVar21 = pCVar21 + 1;
                } while (pCVar21 !=
                         local_108.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              if ((pCVar18 !=
                   local_108.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pCVar18)) {
                local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish = pCVar18;
              }
              removeClique(this,(HighsInt)local_b8);
              pCVar24 = local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pCVar26 = local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start; pCVar26 != pCVar24;
                  pCVar26 = pCVar26 + 1) {
                uVar16 = (int)*pCVar26 << 1 | (uint)((int)*pCVar26 < 0);
                local_e8.addCands = (anon_class_24_3_1a0f6629 *)this;
                HighsHashTree<int,_int>::
                for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2167:46)_&,_0>
                          ((NodePtr)(this->invertedHashList).
                                    super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar16].root.
                                    ptrAndType,(anon_class_8_1_8991fb9c *)&local_e8);
                local_e8.addCands = (anon_class_24_3_1a0f6629 *)this;
                HighsHashTree<int,_void>::
                for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2173:53)_&,_0>
                          ((NodePtr)(this->invertedHashListSizeTwo).
                                    super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar16].root.
                                    ptrAndType,(anon_class_8_1_8991fb9c *)&local_e8);
              }
              piVar34 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar12 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (piVar34 == piVar12) {
                bVar35 = true;
                local_d0 = (ulong)local_d0._4_4_ << 0x20;
              }
              else {
                local_dc = 0x7fffffff;
                local_d0 = (ulong)local_d0._4_4_ << 0x20;
                do {
                  pCVar24 = local_108.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  iVar25 = *piVar34;
                  local_e8.addCands._0_4_ = iVar25;
                  puVar13 = (this->cliquehits).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar16 = puVar13[iVar25];
                  puVar13[iVar25] = 0;
                  pCVar8 = (this->cliques).
                           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (uVar16 == (uint)((ulong)((long)local_108.
                                                                                                          
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_108.
                                                                                                        
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2))
                  {
                    local_d0 = CONCAT44(local_d0._4_4_,(int)CONCAT71((int7)((ulong)pCVar8 >> 8),1));
                    if ((pCVar8[iVar25].origin | 0x80000000U) != 0xffffffff) {
                      local_dc = pCVar8[iVar25].origin;
                    }
                  }
                  else if (pCVar8[iVar25].end - (pCVar8[iVar25].start + pCVar8[iVar25].numZeroFixed)
                           == uVar16) {
                    pCVar26 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (pCVar8[iVar25].equality == true) {
                      for (; pCVar26 != pCVar24; pCVar26 = pCVar26 + 1) {
                        local_bc = *pCVar26;
                        pCVar8 = (this->cliques).
                                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar16 = (int)local_bc << 1 | (uint)((int)local_bc < 0);
                        uVar32 = ((ulong)local_e8.addCands & 0xffffffff) * -0x7f3769c41c1b3d0d +
                                 0x9eefcacfe7301de3 >> 0x20 ^
                                 ((ulong)local_e8.addCands & 0xffffffff) * -0x75e7c76a1153eaca +
                                 0x1da24fc66dd63e32;
                        if (pCVar8[(int)local_e8.addCands].end -
                            pCVar8[(int)local_e8.addCands].start == 2) {
                          pVVar19 = HighsHashTree<int,_void>::find_recurse
                                              ((NodePtr)(this->invertedHashListSizeTwo).
                                                                                                                
                                                  super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar16].root.ptrAndType,uVar32,0,
                                               (int *)&local_e8);
                        }
                        else {
                          pVVar19 = HighsHashTree<int,_int>::find_recurse
                                              ((NodePtr)(this->invertedHashList).
                                                                                                                
                                                  super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar16].root.ptrAndType,uVar32,0,
                                               (int *)&local_e8);
                        }
                        if (pVVar19 == (ValueType *)0x0) {
                          __position._M_current =
                               (this->infeasvertexstack).
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this->infeasvertexstack).
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::
                            vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            ::_M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                                      (local_70,__position,&local_bc);
                          }
                          else {
                            *__position._M_current = local_bc;
                            ppCVar1 = &(this->infeasvertexstack).
                                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                            *ppCVar1 = *ppCVar1 + 1;
                          }
                        }
                      }
                    }
                    else {
                      removeClique(this,iVar25);
                    }
                  }
                  piVar34 = piVar34 + 1;
                } while (piVar34 != piVar12);
                bVar35 = local_dc == 0x7fffffff;
              }
              this_00 = local_90;
              pHVar28 = local_d8;
              piVar10 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar10) {
                (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar10;
              }
              uVar16 = (uint)(uVar29 >> 2);
              if ((local_d0 & 1) == 0) {
                if (0 < (int)uVar16) {
                  uVar29 = (ulong)(uVar16 & 0x7fffffff);
                  lVar33 = 0;
                  do {
                    std::
                    vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                    ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                              (this_00,&local_e0,
                               (CliqueVar *)
                               ((long)&(local_108.
                                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->field_0x0 +
                               lVar33));
                    lVar33 = lVar33 + 4;
                    uVar29 = uVar29 - 1;
                  } while (uVar29 != 0);
                }
                lVar33 = (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                pCVar24 = local_108.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < lVar33) {
                  pdVar14 = (pHVar28->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar15 = (pHVar28->col_upper_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pCVar24 = (pointer)(&(local_108.
                                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->field_0x0 +
                                     ((long)local_108.
                                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_108.
                                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                            ._M_impl.super__Vector_impl_data._M_start &
                                     0xfffffffffffffff0));
                  lVar33 = lVar33 + 1;
                  pCVar21 = local_108.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2;
                  do {
                    uVar16 = (uint)pCVar21[-2] & 0x7fffffff;
                    dVar4 = pdVar14[uVar16];
                    if (((dVar4 == pdVar15[uVar16]) && (!NAN(dVar4) && !NAN(pdVar15[uVar16]))) &&
                       ((int)dVar4 == ~(uint)pCVar21[-2] >> 0x1f)) {
                      pCVar21 = pCVar21 + -2;
                      goto LAB_002679b5;
                    }
                    uVar16 = (uint)pCVar21[-1] & 0x7fffffff;
                    dVar4 = pdVar14[uVar16];
                    if (((dVar4 == pdVar15[uVar16]) && (!NAN(dVar4) && !NAN(pdVar15[uVar16]))) &&
                       ((int)dVar4 == ~(uint)pCVar21[-1] >> 0x1f)) {
                      pCVar21 = pCVar21 + -1;
                      goto LAB_002679b5;
                    }
                    uVar16 = (uint)*pCVar21 & 0x7fffffff;
                    dVar4 = pdVar14[uVar16];
                    if (((dVar4 == pdVar15[uVar16]) && (!NAN(dVar4) && !NAN(pdVar15[uVar16]))) &&
                       ((int)dVar4 == ~(uint)*pCVar21 >> 0x1f)) goto LAB_002679b5;
                    uVar16 = (uint)pCVar21[1] & 0x7fffffff;
                    dVar4 = pdVar14[uVar16];
                    if (((dVar4 == pdVar15[uVar16]) && (!NAN(dVar4) && !NAN(pdVar15[uVar16]))) &&
                       ((int)dVar4 == ~(uint)pCVar21[1] >> 0x1f)) {
                      pCVar21 = pCVar21 + 1;
                      goto LAB_002679b5;
                    }
                    lVar33 = lVar33 + -1;
                    pCVar21 = pCVar21 + 4;
                  } while (1 < lVar33);
                }
                lVar33 = (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar24 >> 2;
                if (lVar33 == 1) {
LAB_0026792d:
                  uVar16 = (uint)*pCVar24 & 0x7fffffff;
                  dVar4 = (pHVar28->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar16];
                  if ((int)dVar4 != ~(uint)*pCVar24 >> 0x1f) {
                    pCVar24 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  pdVar3 = (pHVar28->col_upper_).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar16;
                  if (dVar4 != *pdVar3) {
                    pCVar24 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  pCVar21 = pCVar24;
                  if (NAN(dVar4) || NAN(*pdVar3)) {
                    pCVar21 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                else if (lVar33 == 2) {
LAB_002678f5:
                  uVar16 = (uint)*pCVar24 & 0x7fffffff;
                  dVar4 = (pHVar28->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar16];
                  pdVar3 = (pHVar28->col_upper_).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar16;
                  if (((dVar4 != *pdVar3) || (NAN(dVar4) || NAN(*pdVar3))) ||
                     (pCVar21 = pCVar24, (int)dVar4 != ~(uint)*pCVar24 >> 0x1f)) {
                    pCVar24 = pCVar24 + 1;
                    goto LAB_0026792d;
                  }
                }
                else {
                  pCVar21 = local_108.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (lVar33 == 3) {
                    uVar16 = (uint)*pCVar24 & 0x7fffffff;
                    dVar4 = (pHVar28->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar16];
                    pdVar3 = (pHVar28->col_upper_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar16;
                    if (((dVar4 != *pdVar3) || (NAN(dVar4) || NAN(*pdVar3))) ||
                       (pCVar21 = pCVar24, (int)dVar4 != ~(uint)*pCVar24 >> 0x1f)) {
                      pCVar24 = pCVar24 + 1;
                      goto LAB_002678f5;
                    }
                  }
                }
LAB_002679b5:
                pCVar18 = pCVar21 + 1;
                if (pCVar18 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish &&
                    pCVar21 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  do {
                    CVar27 = *pCVar18;
                    dVar4 = (pHVar28->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[(uint)CVar27 & 0x7fffffff];
                    pdVar3 = (pHVar28->col_upper_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + ((uint)CVar27 & 0x7fffffff);
                    if (((dVar4 != *pdVar3) || (NAN(dVar4) || NAN(*pdVar3))) ||
                       ((int)dVar4 != ~(uint)CVar27 >> 0x1f)) {
                      *pCVar21 = CVar27;
                      pCVar21 = pCVar21 + 1;
                    }
                    pCVar18 = pCVar18 + 1;
                  } while (pCVar18 !=
                           local_108.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                }
                if ((pCVar21 !=
                     local_108.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
                   (local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pCVar21)) {
                  local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pCVar21;
                }
                uVar29 = (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2;
                pvVar31 = local_b0;
                if (1 < uVar29) {
                  doAddClique(this,local_108.
                                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar29,false,
                              local_e0);
                  pvVar31 = local_b0;
                }
              }
              else {
                pvVar31 = local_b0;
                if (bVar35) {
                  if (0 < (int)uVar16) {
                    uVar29 = (ulong)(uVar16 & 0x7fffffff);
                    lVar33 = 0;
                    do {
                      std::
                      vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                      ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                                (this_00,&local_e0,
                                 (CliqueVar *)
                                 ((long)&(local_108.
                                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->field_0x0 +
                                 lVar33));
                      lVar33 = lVar33 + 4;
                      uVar29 = uVar29 - 1;
                      pvVar31 = local_b0;
                    } while (uVar29 != 0);
                  }
                }
                else {
                  __position_00._M_current =
                       (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position_00._M_current ==
                      (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_a0,__position_00,&local_e0);
                    pvVar31 = local_b0;
                  }
                  else {
                    *__position_00._M_current = local_e0;
                    (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
                  }
                }
              }
            }
            if (local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              local_108.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_108.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            }
            processInfeasibleVertices(this,pHVar28);
            bVar35 = local_c4 <= this->numEntries;
            uVar32 = local_80;
            uVar30 = local_b8;
          }
          uVar29 = local_98;
          uVar16 = local_c0;
          if (bVar35) break;
        }
      }
      uVar30 = uVar30 + 1;
      uVar29 = local_98;
      uVar16 = local_c0;
    } while (uVar30 != uVar32);
  }
  if (((uVar16 & 1) != 0) && ((int)uVar29 != 0)) {
    lVar33 = 8;
    uVar32 = 0;
    do {
      pCVar8 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = (long)*(int *)((long)pCVar8 + lVar33 + -8);
      if ((lVar22 != -1) && (*(int *)((long)&pCVar8->start + lVar33) == -1)) {
        if (local_108.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_108.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_108.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_108.
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    *)&local_108,
                   local_108.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (this->cliqueentries).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar22);
        removeClique(this,(HighsInt)uVar32);
        runCliqueMerging(this,pHVar28,&local_108,false);
        uVar30 = (long)local_108.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_108.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2;
        if (1 < uVar30) {
          doAddClique(this,local_108.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar30,false,
                      0x7fffffff);
        }
      }
      uVar32 = uVar32 + 1;
      lVar33 = lVar33 + 0x14;
    } while ((uVar29 & 0xffffffff) != uVar32);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start != (CliqueVar *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain) {
  std::vector<CliqueVar> extensionvars;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  if (cliquehits.size() < cliques.size()) cliquehits.resize(cliques.size());

  HighsInt numcliqueslots = cliques.size();
  const HighsInt maxNewEntries = numEntries + globaldomain.numModelNonzeros();
  bool haveNonModelCliquesToMerge = false;
  for (HighsInt k = 0; k != numcliqueslots; ++k) {
    if (cliques[k].start == -1) continue;
    if (!cliques[k].equality && cliques[k].origin == kHighsIInf) continue;
    if (cliques[k].origin == -1) {
      haveNonModelCliquesToMerge = true;
      continue;
    }
    HighsInt numclqvars = cliques[k].end - cliques[k].start;
    assert(numclqvars != 0);
    if (numclqvars == 0) continue;

    CliqueVar* clqvars = &cliqueentries[cliques[k].start];

    CliqueVar extensionstart = clqvars[0];
    HighsInt numcliques = numCliques(clqvars[0]);
    for (HighsInt i = 1; i != numclqvars; ++i) {
      HighsInt thisNumClqs = numCliques(clqvars[i]);
      if (thisNumClqs < numcliques) {
        numcliques = thisNumClqs;
        extensionstart = clqvars[i];
      }
    }

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = true;

    auto addCands = [&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (iscandidate[cliqueentries[i].index()] ||
            globaldomain.isFixed(cliqueentries[i].col))
          continue;

        iscandidate[cliqueentries[i].index()] = true;
        extensionvars.push_back(cliqueentries[i]);
      }
    };

    invertedHashList[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    invertedHashListSizeTwo[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = false;
    for (CliqueVar v : extensionvars) iscandidate[v.index()] = false;

    for (HighsInt i = 0; i != numclqvars && !extensionvars.empty(); ++i) {
      if (clqvars[i] == extensionstart) continue;

      HighsInt newSize = shrinkToNeighbourhood(
          neighbourhoodInds, numNeighbourhoodQueries, clqvars[i],
          extensionvars.data(), extensionvars.size());
      extensionvars.erase(extensionvars.begin() + newSize, extensionvars.end());
    }

    if (!extensionvars.empty()) {
      // todo, shuffle extension vars?
      randgen.shuffle(extensionvars.data(), extensionvars.size());
      size_t i = 0;
      while (i < extensionvars.size()) {
        CliqueVar extvar = extensionvars[i];
        i += 1;

        HighsInt newSize =
            i + shrinkToNeighbourhood(
                    neighbourhoodInds, numNeighbourhoodQueries, extvar,
                    extensionvars.data() + i, extensionvars.size() - i);
        extensionvars.erase(extensionvars.begin() + newSize,
                            extensionvars.end());
      }
    }

    if (cliques[k].equality) {
      for (CliqueVar v : extensionvars)
        vertexInfeasible(globaldomain, v.col, v.val);
    } else {
      HighsInt originrow = cliques[k].origin;
      cliques[k].origin = kHighsIInf;

      HighsInt numExtensions = extensionvars.size();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      extensionvars.erase(
          std::remove_if(
              extensionvars.begin() + numExtensions, extensionvars.end(),
              [&](CliqueVar clqvar) { return colDeleted[clqvar.col]; }),
          extensionvars.end());
      removeClique(k);

      for (CliqueVar v : extensionvars) {
        invertedHashList[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });

        invertedHashListSizeTwo[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });
      }

      bool redundant = false;
      HighsInt dominatingOrigin = kHighsIInf;
      for (HighsInt cliqueid : cliquehitinds) {
        HighsInt hits = cliquehits[cliqueid];
        cliquehits[cliqueid] = 0;

        if (hits == (HighsInt)extensionvars.size()) {
          redundant = true;
          if (cliques[cliqueid].origin != kHighsIInf &&
              cliques[cliqueid].origin != -1)
            dominatingOrigin = cliques[cliqueid].origin;
        } else if (cliques[cliqueid].end - cliques[cliqueid].start -
                       cliques[cliqueid].numZeroFixed ==
                   hits) {
          if (cliques[cliqueid].equality) {
            for (CliqueVar v : extensionvars) {
              bool sizeTwo =
                  cliques[cliqueid].end - cliques[cliqueid].start == 2;
              bool vHasClq =
                  sizeTwo
                      ? invertedHashListSizeTwo[v.index()].contains(cliqueid)
                      : invertedHashList[v.index()].contains(cliqueid);
              if (!vHasClq) infeasvertexstack.push_back(v);
            }
          } else {
            removeClique(cliqueid);
          }
        }
      }

      cliquehitinds.clear();

      if (!redundant) {
        for (HighsInt i = 0; i < numExtensions; ++i)
          cliqueextensions.emplace_back(originrow, extensionvars[i]);

        extensionvars.erase(
            std::remove_if(extensionvars.begin(), extensionvars.end(),
                           [&](CliqueVar v) {
                             return globaldomain.isFixed(v.col) &&
                                    static_cast<int>(
                                        globaldomain.col_lower_[v.col]) ==
                                        static_cast<int>(1 - v.val);
                           }),
            extensionvars.end());

        if (extensionvars.size() > 1)
          doAddClique(extensionvars.data(), extensionvars.size(), false,
                      originrow);
      } else {
        // the extended clique is redundant, check if the row can be removed
        if (dominatingOrigin != kHighsIInf)
          deletedrows.push_back(originrow);
        else {
          // this clique is redundant in the cliquetable but its row is not
          // necessarily. Also there might be rows that have been deleted due to
          // being dominated by this row after adding the lifted entries so they
          // must be added to the cliqueextension vector
          for (HighsInt i = 0; i < numExtensions; ++i)
            cliqueextensions.emplace_back(originrow, extensionvars[i]);
        }
      }
    }

    extensionvars.clear();
    processInfeasibleVertices(globaldomain);

    if (numEntries >= maxNewEntries) break;
    // printf("nonzeroDelta: %d, maxNonzeroDelta: %d\n", nonzeroDelta,
    // maxNonzeroDelta);
  }

  if (haveNonModelCliquesToMerge) {
    for (HighsInt k = 0; k != numcliqueslots; ++k) {
      if (cliques[k].start == -1) continue;
      if (cliques[k].origin != -1) continue;
      // if (cliques[k].end - cliques[k].start <= 1000) continue;

      // printf("numEntries before: %d\n", numEntries);
      extensionvars.clear();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      removeClique(k);
      runCliqueMerging(globaldomain, extensionvars);

      if (extensionvars.size() > 1)
        doAddClique(extensionvars.data(), extensionvars.size());
    }
  }
}